

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.cpp
# Opt level: O1

void __thiscall
trun::SubProcess::Start(SubProcess *this,Ref *library,Ref *useModule,string *ipcName)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar1;
  long lVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  id __tmp;
  undefined8 uVar5;
  long local_60;
  long *local_58;
  SubProcess *local_50;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  peVar3 = (useModule->super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var4 = (useModule->super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  (useModule->super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (useModule->super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x60);
  *(element_type **)(this + 0x58) = peVar3;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x60) = p_Var4;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  uVar5 = std::chrono::_V2::system_clock::now();
  *(undefined8 *)(this + 0x68) = uVar5;
  *(undefined4 *)(*(long *)(this + 0x58) + 8) = 1;
  local_48 = (library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_40 = (library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
  }
  pcVar1 = (ipcName->_M_dataplus)._M_p;
  local_50 = this;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + ipcName->_M_string_length);
  local_60 = 0;
  local_58 = (long *)operator_new(0x40);
  *local_58 = (long)&PTR___State_impl_00226d10;
  local_58[1] = (long)local_50;
  local_58[2] = (long)local_48;
  local_58[3] = (long)local_40;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
  }
  local_58[4] = (long)(local_58 + 6);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_58 + 4),local_38,local_30 + (long)local_38);
  std::thread::_M_start_thread(&local_60,&local_58,0);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  lVar2 = *(long *)(this + 0x50);
  if (lVar2 == 0) {
    *(long *)(this + 0x50) = local_60;
    local_60 = lVar2;
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    }
    return;
  }
  std::terminate();
}

Assistant:

void SubProcess::Start(const IDynLibrary::Ref &library, TestModule::Ref useModule, const std::string &ipcName) {
    // Save this locally, we need to update the state
    module = std::move(useModule);

    // Need to do this before spinning up the thread...
    tStart = pclock::now();

    module->ChangeState(TestModule::kState::Executing);

    // Note: CAN'T USE REFERENCES - they will change before capture actually takes place..
    thread = std::thread([this, library, ipcName]() {
        state = SubProcessState::kRunning;

        //
        // TO-DO
        //  - Forward certain config settings (like; -G/-D/-r/-c/-C
        //
        std::string optionals = {};
        if (!Config::Instance().testGlobalMain) optionals += "G";
        if (!Config::Instance().linuxUseDeepBinding) optionals += "D";
        if (!Config::Instance().skipOnModuleFail) optionals += "c";
        if (!Config::Instance().stopOnAllFail) optionals += "C";

        proc = new Process(Config::Instance().appName);
        proc->SetCallback(&dataHandler);
        name = module->name;
        if(!optionals.empty()) {
            optionals = "-" + optionals;
            proc->AddArgument(optionals);
        }

        proc->AddArgument("--sequential");  // otherwise we would fork ourselves
        proc->AddArgument("--subprocess");  // hidden; telling trun it's running as a sub-process
        proc->AddArgument("--ipc-name");    // hidden; telling trun which IPC FIFO file name it should use
        proc->AddArgument(ipcName);
        proc->AddArgument("-m");            // Append the module
        proc->AddArgument(module->name);
        proc->AddArgument(library->Name());
        wasProcessExecOk = proc->ExecuteAndWait();
        state = SubProcessState::kFinished;
        exitStatus = proc->GetExitStatus();
    });

}